

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_cry_AppStoreReceipt.cpp
# Opt level: O0

char * __thiscall
axl::cry::AppStoreReceiptPayloadParser::decode
          (AppStoreReceiptPayloadParser *this,State state,int expectedTag,char *unexpectedTagError,
          char *p,size_t size)

{
  int iVar1;
  AppStoreIap *pAVar2;
  char *pcVar3;
  uint64_t uVar4;
  undefined8 in_RCX;
  int in_EDX;
  undefined4 in_ESI;
  long *in_RDI;
  EVP_PKEY_CTX *in_R8;
  char *in_R9;
  size_t size_1;
  char *end;
  int retCode;
  int cls;
  int tag;
  long length;
  ErrorRef *in_stack_fffffffffffffdc8;
  char *in_stack_fffffffffffffdd0;
  AppStoreIap *in_stack_fffffffffffffde0;
  ListBase<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>,_axl::sl::Iterator<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>_>_>
  *in_stack_fffffffffffffde8;
  char *in_stack_fffffffffffffdf0;
  char *in_stack_fffffffffffffdf8;
  ErrorRef *in_stack_fffffffffffffe00;
  AppStoreIap *in_stack_fffffffffffffe10;
  StringRef *in_stack_fffffffffffffe38;
  char local_128 [168];
  IteratorImpl<axl::sl::Iterator<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>_>,_axl::cry::AppStoreIap,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>_>
  local_80;
  EVP_PKEY_CTX *local_78;
  uint local_44;
  int local_40;
  int local_3c;
  EVP_PKEY_CTX *in_stack_ffffffffffffffc8;
  int expectedTag_00;
  State state_00;
  EVP_PKEY_CTX *local_8;
  
  local_44 = ASN1_get_object((uchar **)&stack0xffffffffffffffd8,(long *)&stack0xffffffffffffffc8,
                             &local_3c,&local_40,(long)in_R9);
  if ((local_44 & 0x80) == 0) {
    if (local_3c == in_EDX) {
      local_78 = in_R8 + (long)in_stack_ffffffffffffffc8;
      expectedTag_00 = (int)in_RCX;
      state_00 = (State)((ulong)in_RCX >> 0x20);
      switch(in_ESI) {
      case 1:
        while (in_R8 < local_78) {
          in_R8 = (EVP_PKEY_CTX *)
                  decode((AppStoreReceiptPayloadParser *)CONCAT44(in_ESI,in_EDX),
                         (State)((ulong)in_RCX >> 0x20),(int)in_RCX,(char *)in_R8,in_R9,
                         (size_t)in_stack_ffffffffffffffc8);
          if (in_R8 == (EVP_PKEY_CTX *)0x0) {
            return (char *)0x0;
          }
        }
        break;
      case 2:
        *(undefined4 *)(in_RDI + 2) = 0;
        in_RDI[3] = 0;
        in_RDI[4] = (long)(in_RDI + 2);
        in_RDI[5] = 4;
        pcVar3 = decode((AppStoreReceiptPayloadParser *)CONCAT44(in_ESI,in_EDX),state_00,
                        expectedTag_00,(char *)in_R8,in_R9,(size_t)in_stack_ffffffffffffffc8);
        if (pcVar3 == (char *)0x0) {
          return (char *)0x0;
        }
        in_RDI[4] = 0;
        pcVar3 = decode((AppStoreReceiptPayloadParser *)CONCAT44(in_ESI,in_EDX),
                        (State)((ulong)in_RCX >> 0x20),(int)in_RCX,pcVar3,in_R9,
                        (size_t)in_stack_ffffffffffffffc8);
        if (pcVar3 == (char *)0x0) {
          return (char *)0x0;
        }
        pcVar3 = decode((AppStoreReceiptPayloadParser *)CONCAT44(in_ESI,in_EDX),
                        (State)((ulong)in_RCX >> 0x20),(int)in_RCX,pcVar3,in_R9,
                        (size_t)in_stack_ffffffffffffffc8);
        if (pcVar3 == (char *)0x0) {
          return (char *)0x0;
        }
        break;
      case 3:
        iVar1 = (int)in_RDI[2];
        if (iVar1 == 2) {
          sl::Array<char,_axl::sl::ArrayDetails<char>_>::copy
                    ((Array<char,_axl::sl::ArrayDetails<char>_> *)(*in_RDI + 0xb0),in_R8,
                     in_stack_ffffffffffffffc8);
          in_RDI[3] = *in_RDI;
          in_R8 = (EVP_PKEY_CTX *)
                  decode((AppStoreReceiptPayloadParser *)CONCAT44(in_ESI,in_EDX),
                         (State)((ulong)in_RCX >> 0x20),(int)in_RCX,(char *)in_R8,in_R9,
                         (size_t)in_stack_ffffffffffffffc8);
        }
        else if (iVar1 == 3) {
          in_RDI[3] = *in_RDI + 0x20;
          in_R8 = (EVP_PKEY_CTX *)
                  decode((AppStoreReceiptPayloadParser *)CONCAT44(in_ESI,in_EDX),state_00,
                         expectedTag_00,(char *)in_R8,in_R9,(size_t)in_stack_ffffffffffffffc8);
        }
        else if (iVar1 == 4) {
          sl::Array<char,_axl::sl::ArrayDetails<char>_>::copy
                    ((Array<char,_axl::sl::ArrayDetails<char>_> *)(*in_RDI + 200),in_R8,
                     in_stack_ffffffffffffffc8);
        }
        else if (iVar1 == 5) {
          sl::Array<char,_axl::sl::ArrayDetails<char>_>::copy
                    ((Array<char,_axl::sl::ArrayDetails<char>_> *)(*in_RDI + 0xe0),in_R8,
                     in_stack_ffffffffffffffc8);
        }
        else if (iVar1 == 0xc) {
          in_RDI[3] = *in_RDI + 0x60;
          in_R8 = (EVP_PKEY_CTX *)
                  decode((AppStoreReceiptPayloadParser *)CONCAT44(in_ESI,in_EDX),state_00,
                         expectedTag_00,(char *)in_R8,in_R9,(size_t)in_stack_ffffffffffffffc8);
          uVar4 = decodeRfc3339Timestamp(in_stack_fffffffffffffe38);
          *(uint64_t *)(*in_RDI + 0xa0) = uVar4;
        }
        else if (iVar1 == 0x11) {
          operator_new(0x120);
          AppStoreIap::AppStoreIap(in_stack_fffffffffffffe10);
          local_80.
          super_IteratorBase<axl::sl::Iterator<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>_>,_axl::cry::AppStoreIap,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>_>
          .m_p = (IteratorBase<axl::sl::Iterator<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>_>,_axl::cry::AppStoreIap,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>_>
                  )sl::
                   ListBase<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>,_axl::sl::Iterator<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>_>_>
                   ::insertTail(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
          pAVar2 = sl::
                   IteratorImpl<axl::sl::Iterator<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>_>,_axl::cry::AppStoreIap,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>_>
                   ::operator*(&local_80);
          in_RDI[1] = (long)pAVar2;
          in_R8 = (EVP_PKEY_CTX *)
                  decode((AppStoreReceiptPayloadParser *)CONCAT44(in_ESI,in_EDX),
                         (State)((ulong)in_RCX >> 0x20),(int)in_RCX,(char *)in_R8,in_R9,
                         (size_t)in_stack_ffffffffffffffc8);
          in_RDI[1] = 0;
        }
        else if (iVar1 == 0x13) {
          in_RDI[3] = *in_RDI + 0x40;
          in_R8 = (EVP_PKEY_CTX *)
                  decode((AppStoreReceiptPayloadParser *)CONCAT44(in_ESI,in_EDX),state_00,
                         expectedTag_00,(char *)in_R8,in_R9,(size_t)in_stack_ffffffffffffffc8);
        }
        else if (iVar1 == 0x6a5) {
          if (in_RDI[1] == 0) {
            err::ErrorRef::ErrorRef(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
            pcVar3 = err::fail<char_const*>(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
            err::ErrorRef::~ErrorRef((ErrorRef *)0x14efe8);
            return pcVar3;
          }
          in_RDI[4] = in_RDI[1] + 0x10;
          in_RDI[5] = 8;
          in_R8 = (EVP_PKEY_CTX *)
                  decode((AppStoreReceiptPayloadParser *)CONCAT44(in_ESI,in_EDX),state_00,
                         expectedTag_00,(char *)in_R8,in_R9,(size_t)in_stack_ffffffffffffffc8);
        }
        else if (iVar1 == 0x6a6) {
          if (in_RDI[1] == 0) {
            err::ErrorRef::ErrorRef(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
            pcVar3 = err::fail<char_const*>(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
            err::ErrorRef::~ErrorRef((ErrorRef *)0x14f0c5);
            return pcVar3;
          }
          in_RDI[3] = in_RDI[1] + 0x20;
          in_R8 = (EVP_PKEY_CTX *)
                  decode((AppStoreReceiptPayloadParser *)CONCAT44(in_ESI,in_EDX),state_00,
                         expectedTag_00,(char *)in_R8,in_R9,(size_t)in_stack_ffffffffffffffc8);
        }
        else if (iVar1 == 0x6a7) {
          if (in_RDI[1] == 0) {
            err::ErrorRef::ErrorRef(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
            pcVar3 = err::fail<char_const*>(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
            err::ErrorRef::~ErrorRef((ErrorRef *)0x14f18e);
            return pcVar3;
          }
          in_RDI[3] = in_RDI[1] + 0x40;
          in_R8 = (EVP_PKEY_CTX *)
                  decode((AppStoreReceiptPayloadParser *)CONCAT44(in_ESI,in_EDX),state_00,
                         expectedTag_00,(char *)in_R8,in_R9,(size_t)in_stack_ffffffffffffffc8);
        }
        else if (iVar1 == 0x6a8) {
          if (in_RDI[1] == 0) {
            err::ErrorRef::ErrorRef(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
            pcVar3 = err::fail<char_const*>(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
            err::ErrorRef::~ErrorRef((ErrorRef *)0x14f257);
            return pcVar3;
          }
          in_RDI[3] = in_RDI[1] + 0x80;
          in_R8 = (EVP_PKEY_CTX *)
                  decode((AppStoreReceiptPayloadParser *)CONCAT44(in_ESI,in_EDX),state_00,
                         expectedTag_00,(char *)in_R8,in_R9,(size_t)in_stack_ffffffffffffffc8);
          uVar4 = decodeRfc3339Timestamp(in_stack_fffffffffffffe38);
          *(uint64_t *)(in_RDI[1] + 0x100) = uVar4;
        }
        else if (iVar1 == 0x6a9) {
          if (in_RDI[1] == 0) {
            err::ErrorRef::ErrorRef(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
            pcVar3 = err::fail<char_const*>(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
            err::ErrorRef::~ErrorRef((ErrorRef *)0x14f353);
            return pcVar3;
          }
          in_RDI[3] = in_RDI[1] + 0x60;
          in_R8 = (EVP_PKEY_CTX *)
                  decode((AppStoreReceiptPayloadParser *)CONCAT44(in_ESI,in_EDX),state_00,
                         expectedTag_00,(char *)in_R8,in_R9,(size_t)in_stack_ffffffffffffffc8);
        }
        else if (iVar1 == 0x6aa) {
          if (in_RDI[1] == 0) {
            err::ErrorRef::ErrorRef(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
            pcVar3 = err::fail<char_const*>(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
            err::ErrorRef::~ErrorRef((ErrorRef *)0x14f41c);
            return pcVar3;
          }
          in_RDI[3] = in_RDI[1] + 0xa0;
          in_R8 = (EVP_PKEY_CTX *)
                  decode((AppStoreReceiptPayloadParser *)CONCAT44(in_ESI,in_EDX),state_00,
                         expectedTag_00,(char *)in_R8,in_R9,(size_t)in_stack_ffffffffffffffc8);
          uVar4 = decodeRfc3339Timestamp(in_stack_fffffffffffffe38);
          *(uint64_t *)(in_RDI[1] + 0x108) = uVar4;
        }
        else if (iVar1 == 0x6ac) {
          if (in_RDI[1] == 0) {
            err::ErrorRef::ErrorRef(in_stack_fffffffffffffe00,local_128);
            pcVar3 = err::fail<char_const*>(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
            err::ErrorRef::~ErrorRef((ErrorRef *)0x14f518);
            return pcVar3;
          }
          in_RDI[3] = in_RDI[1] + 0xc0;
          in_R8 = (EVP_PKEY_CTX *)
                  decode((AppStoreReceiptPayloadParser *)CONCAT44(in_ESI,in_EDX),state_00,
                         expectedTag_00,(char *)in_R8,in_R9,(size_t)in_stack_ffffffffffffffc8);
          uVar4 = decodeRfc3339Timestamp(in_stack_fffffffffffffe38);
          *(uint64_t *)(in_RDI[1] + 0x110) = uVar4;
        }
        else if (iVar1 == 0x6af) {
          if (in_RDI[1] == 0) {
            err::ErrorRef::ErrorRef(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
            pcVar3 = err::fail<char_const*>(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
            err::ErrorRef::~ErrorRef((ErrorRef *)0x14f614);
            return pcVar3;
          }
          in_RDI[4] = in_RDI[1] + 0x18;
          in_RDI[5] = 4;
          in_R8 = (EVP_PKEY_CTX *)
                  decode((AppStoreReceiptPayloadParser *)CONCAT44(in_ESI,in_EDX),state_00,
                         expectedTag_00,(char *)in_R8,in_R9,(size_t)in_stack_ffffffffffffffc8);
        }
        else if (iVar1 == 0x6b0) {
          if (in_RDI[1] == 0) {
            err::ErrorRef::ErrorRef(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
            pcVar3 = err::fail<char_const*>(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
            err::ErrorRef::~ErrorRef((ErrorRef *)0x14f6e5);
            return pcVar3;
          }
          in_RDI[3] = in_RDI[1] + 0xe0;
          in_R8 = (EVP_PKEY_CTX *)
                  decode((AppStoreReceiptPayloadParser *)CONCAT44(in_ESI,in_EDX),state_00,
                         expectedTag_00,(char *)in_R8,in_R9,(size_t)in_stack_ffffffffffffffc8);
          uVar4 = decodeRfc3339Timestamp(in_stack_fffffffffffffe38);
          *(uint64_t *)(in_RDI[1] + 0x118) = uVar4;
        }
        if (in_R8 == (EVP_PKEY_CTX *)0x0) {
          return (char *)0x0;
        }
        break;
      case 4:
        sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::copy
                  ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)in_RDI[3],in_R8,
                   in_stack_ffffffffffffffc8);
        break;
      case 5:
        if (in_RDI[4] != 0) {
          sl::ReverseArray<char>::copyReverse
                    (in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8,
                     (size_t)in_stack_fffffffffffffde0);
        }
      }
      local_8 = local_78;
    }
    else {
      err::ErrorRef::ErrorRef(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      local_8 = (EVP_PKEY_CTX *)
                err::fail<char_const*>(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
      err::ErrorRef::~ErrorRef((ErrorRef *)0x14e969);
    }
  }
  else {
    local_8 = (EVP_PKEY_CTX *)failWithLastCryptoError<char_const*>((char *)0x14e8f3);
  }
  return (char *)local_8;
}

Assistant:

const char*
AppStoreReceiptPayloadParser::decode(
	State state,
	int expectedTag,
	const char* unexpectedTagError,
	const char* p,
	size_t size
) {
	ASSERT(m_receipt);

	long length;
	int tag;
	int cls;

	int retCode = ASN1_get_object((const uchar_t**)&p, &length, &tag, &cls, size);
	if (retCode & 0x80)
		return failWithLastCryptoError<const char*>(NULL);

	if (tag != expectedTag)
		return err::fail<const char*>(NULL, unexpectedTagError);

	const char* end = p + length;

	switch (state) {
	case State_Set:
		while (p < end) {
			p = decode(
				State_Attribute,
				V_ASN1_SEQUENCE,
				"invalid app receipt attribute (expected ASN1 SEQUENCE)",
				p,
				end - p
			);

			if (!p)
				return NULL;
		}

		break;

	case State_Attribute:
		m_attributeId = AttributeId_Undefined;
		m_attributeString = NULL;
		m_attributeInteger = &m_attributeId;
		m_attributeIntegerSize = sizeof(m_attributeId);

		p = decode(
			State_AttributeIntegerValue,
			V_ASN1_INTEGER,
			"invalid app receipt attribute type (expected ASN1 INTEGER)",
			p,
			end - p
		);

		if (!p)
			return NULL;

		m_attributeInteger = NULL; // ignore attribute version value

		p = decode(
			State_AttributeIntegerValue,
			V_ASN1_INTEGER,
			"invalid app receipt attribute version (expected ASN1 INTEGER)",
			p,
			end - p
		);

		if (!p)
			return NULL;

		p = decode(
			State_AttributeValue,
			V_ASN1_OCTET_STRING,
			"invalid app receipt attribute value (expected ASN1 OCTET STRING)",
			p,
			end - p
		);

		if (!p)
			return NULL;

		break;

	case State_AttributeValue:
		switch (m_attributeId) {
		case AttributeId_BundleId:
			m_receipt->m_rawBundleId.copy(p, length);
			m_attributeString = &m_receipt->m_bundleId;

			p = decode(
				State_AttributeStringValue,
				V_ASN1_UTF8STRING,
				"invalid app receipt bundle ID (expected ASN1 UTF8 STRING)",
				p,
				length
			);

			break;

		case AttributeId_AppVersion:
			m_attributeString = &m_receipt->m_appVersion;

			p = decode(
				State_AttributeStringValue,
				V_ASN1_UTF8STRING,
				"invalid app receipt version (expected ASN1 UTF8 STRING)",
				p,
				length
			);

			break;

		case AttributeId_OriginalAppVersion:
			m_attributeString = &m_receipt->m_originalAppVersion;

			p = decode(
				State_AttributeStringValue,
				V_ASN1_UTF8STRING,
				"invalid app receipt original version (expected ASN1 UTF8 STRING)",
				p,
				length
			);

			break;

		case AttributeId_ReceiptCreationDate:
			m_attributeString = &m_receipt->m_receiptCreationDateString;

			p = decode(
				State_AttributeStringValue,
				V_ASN1_IA5STRING,
				"invalid app receipt creation date (expected ASN1 IA5 STRING)",
				p,
				length
			);

			m_receipt->m_receiptCreationTimestamp = decodeRfc3339Timestamp(m_receipt->m_receiptCreationDateString);
			break;

		case AttributeId_Iap:
			m_iap = *m_receipt->m_iapList.insertTail(new AppStoreIap);

			p = decode(
				State_Set,
				V_ASN1_SET,
				"invalid app receipt IAP (expected ASN1 SET)",
				p,
				end - p
			);

			m_iap = NULL;
			break;

		case AttributeId_Opaque:
			m_receipt->m_opaque.copy(p, length);
			break;

		case AttributeId_Sha1Hash:
			m_receipt->m_sha1Hash.copy(p, length);
			break;

		case AttributeId_IapQuantity:
			if (!m_iap)
				return err::fail<const char*>(NULL, "unexpected IAP attribute in app receipt");

			m_attributeInteger = &m_iap->m_quantity;
			m_attributeIntegerSize = sizeof(m_iap->m_quantity);

			p = decode(
				State_AttributeIntegerValue,
				V_ASN1_INTEGER,
				"invalid app receipt IAP quantity (expected ASN1 INTEGER)",
				p,
				length
			);
			break;

		case AttributeId_IapProductId:
			if (!m_iap)
				return err::fail<const char*>(NULL, "unexpected IAP attribute in app receipt");

			m_attributeString = &m_iap->m_productId;

			p = decode(
				State_AttributeStringValue,
				V_ASN1_UTF8STRING,
				"invalid app receipt IAP product ID (expected ASN1 UTF8 STRING)",
				p,
				length
			);

			break;

		case AttributeId_IapTransactionId:
			if (!m_iap)
				return err::fail<const char*>(NULL, "unexpected IAP attribute in app receipt");

			m_attributeString = &m_iap->m_transactionId;

			p = decode(
				State_AttributeStringValue,
				V_ASN1_UTF8STRING,
				"invalid app receipt IAP transaction ID (expected ASN1 UTF8 STRING)",
				p,
				length
			);

			break;

		case AttributeId_IapPurchaseDate:
			if (!m_iap)
				return err::fail<const char*>(NULL, "unexpected IAP attribute in app receipt");

			m_attributeString = &m_iap->m_purchaseDateString;

			p = decode(
				State_AttributeStringValue,
				V_ASN1_IA5STRING,
				"invalid app receipt IAP purchase date (expected ASN1 IA5 STRING)",
				p,
				length
			);

			m_iap->m_purchaseTimestamp = decodeRfc3339Timestamp(m_iap->m_purchaseDateString);
			break;

		case AttributeId_IapOriginalTransactionId:
			if (!m_iap)
				return err::fail<const char*>(NULL, "unexpected IAP attribute in app receipt");

			m_attributeString = &m_iap->m_originalTransactionId;

			p = decode(
				State_AttributeStringValue,
				V_ASN1_UTF8STRING,
				"invalid app receipt IAP original transaction ID (expected ASN1 UTF8 STRING)",
				p,
				length
			);

			break;

		case AttributeId_IapOriginalPurchaseDate:
			if (!m_iap)
				return err::fail<const char*>(NULL, "unexpected IAP attribute in app receipt");

			m_attributeString = &m_iap->m_originalPurchaseDateString;

			p = decode(
				State_AttributeStringValue,
				V_ASN1_IA5STRING,
				"invalid app receipt IAP original purchase date (expected ASN1 IA5 STRING)",
				p,
				length
			);

			m_iap->m_originalPurchaseTimestamp = decodeRfc3339Timestamp(m_iap->m_originalPurchaseDateString);
			break;

		case AttributeId_IapSubscriptionExpirationDate:
			if (!m_iap)
				return err::fail<const char*>(NULL, "unexpected IAP attribute in app receipt");

			m_attributeString = &m_iap->m_subscriptionExpirationDateString;

			p = decode(
				State_AttributeStringValue,
				V_ASN1_IA5STRING,
				"invalid app receipt IAP subscription expiration date (expected ASN1 IA5 STRING)",
				p,
				length
			);

			m_iap->m_subscriptionExpirationTimestamp = decodeRfc3339Timestamp(m_iap->m_subscriptionExpirationDateString);
			break;

		case AttributeId_IapWebOrderLineItemId:
			if (!m_iap)
				return err::fail<const char*>(NULL, "unexpected IAP attribute in app receipt");

			m_attributeInteger = &m_iap->m_webOrderLineItemId;
			m_attributeIntegerSize = sizeof(m_iap->m_webOrderLineItemId);

			p = decode(
				State_AttributeIntegerValue,
				V_ASN1_INTEGER,
				"invalid app receipt IAP web order line item ID (expected ASN1 INTEGER)",
				p,
				length
			);

			break;

		case AttributeId_IapCancellationDate:
			if (!m_iap)
				return err::fail<const char*>(NULL, "unexpected IAP attribute in app receipt");

			m_attributeString = &m_iap->m_cancellationDateString;

			p = decode(
				State_AttributeStringValue,
				V_ASN1_IA5STRING,
				"invalid app receipt IAP purchase date (expected ASN1 IA5 STRING)",
				p,
				length
			);

			m_iap->m_cancellationTimestamp = decodeRfc3339Timestamp(m_iap->m_cancellationDateString);
			break;

		default:
			AXL_TRACE("WARNING: unsupported AppStore Receipt attribute ID: 0x%x\n", m_attributeId);
		}

		if (!p)
			return NULL;

		break;

	case State_AttributeStringValue:
		ASSERT(m_attributeString);
		m_attributeString->copy(p, length);
		break;

	case State_AttributeIntegerValue:
		if (m_attributeInteger) {
			size_t size = AXL_MIN((size_t)length, m_attributeIntegerSize);
			sl::ArrayDetails<char>::copyReverse((char*)m_attributeInteger, p, size); // big-endian
		}

		break;

	default:
		ASSERT(false);
	}

	return end;
}